

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void write_vec_element(DisasContext_conflict1 *s,TCGv_i64 tcg_src,int destidx,int element,
                      MemOp memop)

{
  TCGContext_conflict1 *tcg_ctx;
  int iVar1;
  TCGv_ptr a2;
  TCGOpcode TStack_8;
  
  if (memop < MO_ASHIFT) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar1 = (element << ((byte)memop & 3)) + destidx * 0x100 + 0xc10;
    switch(memop) {
    case MO_8:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_st8_i64;
      break;
    case MO_16:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_st16_i64;
      break;
    case MO_32:
      a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
      TStack_8 = INDEX_op_st32_i64;
      break;
    case MO_64:
      tcg_gen_st_i64_aarch64(tcg_ctx,tcg_src,tcg_ctx->cpu_env,(long)iVar1);
      return;
    }
    tcg_gen_op3_aarch64(tcg_ctx,TStack_8,(TCGArg)(tcg_src + (long)tcg_ctx),(TCGArg)a2,(long)iVar1);
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
             ,0x44c,(char *)0x0);
}

Assistant:

static void write_vec_element(DisasContext *s, TCGv_i64 tcg_src, int destidx,
                              int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, destidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_st8_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_st16_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
        tcg_gen_st32_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_64:
        tcg_gen_st_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}